

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O1

void __thiscall
duckdb::RowVersionManager::CleanupAppend
          (RowVersionManager *this,transaction_t lowest_active_transaction,idx_t row_group_start,
          idx_t count)

{
  ulong uVar1;
  vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> _Var3;
  int iVar4;
  reference pvVar5;
  type pCVar6;
  ulong uVar7;
  ulong __n;
  unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> new_info;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> local_40;
  transaction_t local_38;
  
  if (count != 0) {
    local_38 = lowest_active_transaction;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar4 != 0) {
      ::std::__throw_system_error(iVar4);
    }
    __n = row_group_start >> 0xb;
    uVar1 = (count + row_group_start) - 1;
    uVar7 = uVar1 >> 0xb;
    if (__n <= uVar7) {
      this_00 = &this->vector_info;
      do {
        if (((count + row_group_start) - (uVar1 & 0xfffffffffffff800) == 0x800 || uVar7 != __n) &&
           (__n < (ulong)((long)(this->vector_info).
                                super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                                .
                                super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->vector_info).
                                super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                                .
                                super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3))) {
          pvVar5 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                   ::operator[](this_00,__n);
          if ((pvVar5->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)
              ._M_t.
              super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t
              .super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
              super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl != (ChunkInfo *)0x0) {
            pvVar5 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                     ::operator[](this_00,__n);
            pCVar6 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
                     operator*(pvVar5);
            local_40._M_head_impl = (ChunkInfo *)0x0;
            iVar4 = (*pCVar6->_vptr_ChunkInfo[7])(pCVar6,local_38,&local_40);
            if ((char)iVar4 != '\0') {
              pvVar5 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                       ::operator[](this_00,__n);
              _Var3._M_head_impl = local_40._M_head_impl;
              local_40._M_head_impl = (ChunkInfo *)0x0;
              _Var2._M_head_impl =
                   (pvVar5->
                   super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
                   _M_t.
                   super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>
                   .super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
              (pvVar5->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)
              ._M_t.
              super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t
              .super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
              super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl = _Var3._M_head_impl;
              if (_Var2._M_head_impl != (ChunkInfo *)0x0) {
                (**(code **)((long)(_Var2._M_head_impl)->_vptr_ChunkInfo + 8))();
              }
            }
            if (local_40._M_head_impl != (ChunkInfo *)0x0) {
              (*(local_40._M_head_impl)->_vptr_ChunkInfo[1])();
            }
          }
        }
        __n = __n + 1;
      } while (uVar7 + 1 != __n);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
  }
  return;
}

Assistant:

void RowVersionManager::CleanupAppend(transaction_t lowest_active_transaction, idx_t row_group_start, idx_t count) {
	if (count == 0) {
		return;
	}
	idx_t row_group_end = row_group_start + count;

	lock_guard<mutex> lock(version_lock);
	idx_t start_vector_idx = row_group_start / STANDARD_VECTOR_SIZE;
	idx_t end_vector_idx = (row_group_end - 1) / STANDARD_VECTOR_SIZE;
	for (idx_t vector_idx = start_vector_idx; vector_idx <= end_vector_idx; vector_idx++) {
		idx_t vcount =
		    vector_idx == end_vector_idx ? row_group_end - end_vector_idx * STANDARD_VECTOR_SIZE : STANDARD_VECTOR_SIZE;
		if (vcount != STANDARD_VECTOR_SIZE) {
			// not written fully - skip
			continue;
		}
		if (vector_idx >= vector_info.size() || !vector_info[vector_idx]) {
			// already vacuumed - skip
			continue;
		}
		auto &info = *vector_info[vector_idx];
		// if we wrote the entire chunk info try to compress it
		unique_ptr<ChunkInfo> new_info;
		auto cleanup = info.Cleanup(lowest_active_transaction, new_info);
		if (cleanup) {
			vector_info[vector_idx] = std::move(new_info);
		}
	}
}